

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

void __thiscall
QDBusConnectionPrivate::setConnection
          (QDBusConnectionPrivate *this,DBusConnection *dbc,QDBusErrorInternal *error)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  int iVar1;
  QList<QMetaType> *key;
  QList<QMetaType> *pQVar2;
  QList<QMetaType> *pQVar3;
  DBusConnection *in_RSI;
  QDBusConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QLatin1StringView QVar5;
  SignalHook hook;
  char *service;
  undefined4 in_stack_fffffffffffffd58;
  dbus_bool_t in_stack_fffffffffffffd5c;
  QDBusConnectionPrivate *in_stack_fffffffffffffd60;
  SignalHook *value;
  QDBusErrorInternal *in_stack_fffffffffffffd68;
  QDBusConnectionPrivate *in_stack_fffffffffffffd70;
  QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this_00;
  DBusAddTimeoutFunction in_stack_fffffffffffffd78;
  ContextType *object;
  DBusConnection *in_stack_fffffffffffffd80;
  QList<QMetaType> *in_stack_fffffffffffffd88;
  qsizetype in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  char *asize;
  QDebug local_1d8;
  QDebug local_1d0 [7];
  QMetaType local_198;
  QMetaType local_190;
  QMetaType local_188;
  QMetaType local_180 [13];
  QMetaType local_118;
  QMetaType local_110 [4];
  undefined1 local_f0 [80];
  undefined4 local_a0;
  QMetaType *local_38;
  Data *local_10;
  char16_t *local_8;
  
  local_8 = *(char16_t **)(in_FS_OFFSET + 0x28);
  in_RDI->mode = ClientMode;
  if (in_RSI == (DBusConnection *)0x0) {
    handleError(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  else {
    (in_RDI->field_7).connection = in_RSI;
    local_10 = (Data *)q_dbus_bus_get_unique_name((DBusConnection *)0x16b8a4);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)in_stack_fffffffffffffd70,(char **)in_stack_fffffffffffffd68);
    QVar4.m_data = (storage_type *)local_38;
    QVar4.m_size = (qsizetype)&stack0xffffffffffffffd8;
    QString::fromUtf8(QVar4);
    QString::operator=((QString *)in_stack_fffffffffffffd60,
                       (QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QString::~QString((QString *)0x16b901);
    handleAuthentication(in_stack_fffffffffffffd60);
    q_dbus_connection_set_exit_on_disconnect
              ((DBusConnection *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    q_dbus_connection_set_watch_functions
              (in_stack_fffffffffffffd80,(DBusAddWatchFunction)in_stack_fffffffffffffd78,
               (DBusRemoveWatchFunction)in_stack_fffffffffffffd70,
               (DBusWatchToggledFunction)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (DBusFreeFunction)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    q_dbus_connection_set_timeout_functions
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (DBusRemoveTimeoutFunction)in_stack_fffffffffffffd70,
               (DBusTimeoutToggledFunction)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (DBusFreeFunction)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    q_dbus_connection_set_dispatch_status_function
              ((DBusConnection *)in_stack_fffffffffffffd70,
               (DBusDispatchStatusFunction)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (DBusFreeFunction)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    q_dbus_connection_add_filter
              ((DBusConnection *)in_stack_fffffffffffffd70,
               (DBusHandleMessageFunction)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               (DBusFreeFunction)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    memset(local_f0,0xaa,0xb8);
    SignalHook::SignalHook((SignalHook *)in_stack_fffffffffffffd60);
    QDBusUtil::dbusService();
    QString::operator=((QString *)in_stack_fffffffffffffd60,
                       (QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QString::~QString((QString *)0x16b9f0);
    QString::clear((QString *)in_stack_fffffffffffffd60);
    value = (SignalHook *)&stack0xffffffffffffff68;
    QMetaType::QMetaType(local_110,0x2b);
    key = QList<QMetaType>::operator<<
                    ((QList<QMetaType> *)value,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QMetaType::QMetaType(&local_118,10);
    QList<QMetaType>::operator<<
              ((QList<QMetaType> *)value,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_a0 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    this_00 = &in_RDI->signalHooks;
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)value);
    QVar5.m_data = in_stack_fffffffffffffd98;
    QVar5.m_size = in_stack_fffffffffffffd90;
    QString::QString((QString *)this_00,QVar5);
    QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::insert(this_00,(QString *)key,value);
    QString::~QString((QString *)0x16baff);
    local_a0 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    object = (ContextType *)&in_RDI->signalHooks;
    QVar5 = Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)value);
    asize = QVar5.m_data;
    latin1.m_data = in_stack_fffffffffffffd98;
    latin1.m_size = in_stack_fffffffffffffd90;
    QString::QString((QString *)this_00,latin1);
    QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::insert(this_00,(QString *)key,value);
    QString::~QString((QString *)0x16bb8c);
    QList<QMetaType>::clear((QList<QMetaType> *)value);
    QList<QMetaType>::reserve(in_stack_fffffffffffffd88,(qsizetype)asize);
    QMetaType::QMetaType(local_180,0x2b);
    QList<QMetaType>::operator<<
              ((QList<QMetaType> *)value,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QMetaType::QMetaType(&local_188,10);
    pQVar2 = QList<QMetaType>::operator<<
                       ((QList<QMetaType> *)value,
                        (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QMetaType::QMetaType(&local_190,10);
    pQVar3 = QList<QMetaType>::operator<<
                       ((QList<QMetaType> *)value,
                        (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    QMetaType::QMetaType(&local_198,10);
    QList<QMetaType>::operator<<
              ((QList<QMetaType> *)value,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_a0 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)value);
    latin1_00.m_data = (char *)pQVar3;
    latin1_00.m_size = (qsizetype)pQVar2;
    QString::QString((QString *)this_00,latin1_00);
    QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::insert(this_00,(QString *)key,value);
    QString::~QString((QString *)0x16bcf0);
    watchForDBusDisconnection(in_RDI);
    iVar1 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x16bd06);
    if (iVar1 != 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)key,(int)((ulong)value >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QMessageLogger::debug();
      ::operator<<((QDebug *)local_1d0,(QObject *)&local_1d8);
      QDebug::operator<<((QDebug *)object,(char *)in_RDI);
      QDebug::~QDebug(local_1d0);
      QDebug::~QDebug(&local_1d8);
    }
    QMetaObject::invokeMethod<void(QDBusConnectionPrivate::*)()>
              (object,(offset_in_QDBusConnectionPrivate_to_subr *)this_00,
               (ConnectionType)((ulong)key >> 0x20));
    SignalHook::~SignalHook(value);
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusConnectionPrivate::setConnection(DBusConnection *dbc, const QDBusErrorInternal &error)
{
    mode = ClientMode;
    if (!dbc) {
        handleError(error);
        return;
    }

    connection = dbc;

    const char *service = q_dbus_bus_get_unique_name(connection);
    Q_ASSERT(service);
    baseService = QString::fromUtf8(service);
    // bus connections are already authenticated here because q_dbus_bus_register() has been called
    handleAuthentication();

    q_dbus_connection_set_exit_on_disconnect(connection, false);
    q_dbus_connection_set_watch_functions(connection, qDBusAddWatch, qDBusRemoveWatch,
                                          qDBusToggleWatch, this, nullptr);
    q_dbus_connection_set_timeout_functions(connection, qDBusAddTimeout, qDBusRemoveTimeout,
                                            qDBusToggleTimeout, this, nullptr);
    q_dbus_connection_set_dispatch_status_function(connection, qDBusUpdateDispatchStatus, this, nullptr);
    q_dbus_connection_add_filter(connection, qDBusSignalFilter, this, nullptr);

    // Initialize the hooks for the NameAcquired and NameLost signals
    // we don't use connectSignal here because we don't need the rules to be sent to the bus
    // the bus will always send us these two signals
    SignalHook hook;
    hook.service = QDBusUtil::dbusService();
    hook.path.clear(); // no matching
    hook.obj = this;
    hook.params << QMetaType(QMetaType::Void) << QMetaType(QMetaType::QString); // both functions take a QString as parameter and return void

    hook.midx = staticMetaObject.indexOfSlot("registerServiceNoLock(QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameAcquired:" DBUS_INTERFACE_DBUS ""_L1, hook);

    hook.midx = staticMetaObject.indexOfSlot("unregisterServiceNoLock(QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameLost:" DBUS_INTERFACE_DBUS ""_L1, hook);

    // And initialize the hook for the NameOwnerChanged signal;
    // we don't use connectSignal here because the rules are added by connectSignal on a per-need basis
    hook.params.clear();
    hook.params.reserve(4);
    hook.params << QMetaType(QMetaType::Void) << QMetaType(QMetaType::QString) << QMetaType(QMetaType::QString) << QMetaType(QMetaType::QString);
    hook.midx = staticMetaObject.indexOfSlot("serviceOwnerChangedNoLock(QString,QString,QString)");
    Q_ASSERT(hook.midx != -1);
    signalHooks.insert("NameOwnerChanged:" DBUS_INTERFACE_DBUS ""_L1, hook);

    watchForDBusDisconnection();

    qDBusDebug() << this << ": connected successfully";

    // schedule a dispatch:
    QMetaObject::invokeMethod(this, &QDBusConnectionPrivate::doDispatch, Qt::QueuedConnection);
}